

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::rpc_session::stop(rpc_session *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  __shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2> a_Stack_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  invoke_connection_callback(this,false);
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::rpc_session,void>
              (a_Stack_18,(__weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)this);
    if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar1 = std::__throw_bad_function_call();
      if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
      }
      _Unwind_Resume(uVar1);
    }
    (*(this->callback_)._M_invoker)
              ((_Any_data *)&this->callback_,(shared_ptr<nuraft::rpc_session> *)a_Stack_18);
    if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    }
  }
  this_00 = (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void stop() {
        invoke_connection_callback(false);
        close_socket();
        if (callback_) {
            callback_(this->shared_from_this());
        }
        handler_.reset();
    }